

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * getNextIp(string *__return_storage_ptr__,string *baseIp,int iter)

{
  uint32_t uVar1;
  char *pcVar2;
  allocator<char> local_55;
  in_addr_t local_54;
  string local_50 [36];
  in_addr_t local_2c;
  in_addr_t local_28;
  in_addr address_struct;
  in_addr_t address;
  int i;
  int iter_local;
  string *baseIp_local;
  string *nextIp;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseIp);
  for (address_struct.s_addr = 0; (int)address_struct.s_addr < iter;
      address_struct.s_addr = address_struct.s_addr + 1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_28 = inet_addr(pcVar2);
    uVar1 = ntohl(local_28);
    local_28 = uVar1 + 1;
    local_54 = htonl(local_28);
    local_2c = local_54;
    local_28 = local_54;
    pcVar2 = inet_ntoa((in_addr)local_54);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,pcVar2,&local_55);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_55);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getNextIp(std::string baseIp, const int iter = 1)
{
    std::string nextIp = std::move(baseIp);
    for (int i = 0; i < iter; i++)
    {
        // convert the input IP address to an integer
        in_addr_t address = inet_addr(nextIp.c_str());

        // add one to the value (making sure to get the correct byte orders)
        address = ntohl(address);
        address += 1;
        address = htonl(address);

        // pack the address into the struct inet_ntoa expects
        struct in_addr address_struct;
        address_struct.s_addr = address;

        // convert back to a string
        nextIp = std::string(inet_ntoa(address_struct));
    }
    return nextIp;
}